

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O2

void If_DsdManPrint_rec(FILE *pFile,If_DsdMan_t *p,int iDsdLit,uchar *pPermLits,int *pnSupp)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  If_DsdObj_t *pObj;
  word *pTruth;
  char *pcVar4;
  
  iVar1 = Abc_LitIsCompl(iDsdLit);
  pcVar4 = "!";
  if (iVar1 == 0) {
    pcVar4 = "";
  }
  fputs(pcVar4,(FILE *)pFile);
  iVar1 = Abc_Lit2Var(iDsdLit);
  pObj = (If_DsdObj_t *)Vec_PtrEntry(&p->vObjs,iVar1);
  uVar2 = *(uint *)&pObj->field_0x4 & 7;
  if (uVar2 == 6) {
    pTruth = If_DsdObjTruth(p,pObj);
    Abc_TtPrintHexRev(pFile,pTruth,*(uint *)&pObj->field_0x4 >> 0x1b);
    uVar2 = *(uint *)&pObj->field_0x4 & 7;
  }
  else {
    if (uVar2 == 2) {
      iVar1 = *pnSupp;
      *pnSupp = iVar1 + 1;
      if (pPermLits == (uchar *)0x0) {
        uVar2 = Abc_Var2Lit(iVar1,0);
      }
      else {
        uVar2 = (uint)pPermLits[iVar1];
      }
      iVar1 = Abc_LitIsCompl(uVar2);
      pcVar4 = "!";
      if (iVar1 == 0) {
        pcVar4 = "";
      }
      iVar1 = Abc_Lit2Var(uVar2);
      fprintf((FILE *)pFile,"%s%c",pcVar4,(ulong)(iVar1 + 0x61));
      return;
    }
    if (uVar2 == 1) {
      iVar1 = 0x30;
      goto LAB_003816b5;
    }
  }
  fputc((int)(char)(&DAT_007d7280)[uVar2],(FILE *)pFile);
  for (uVar2 = 0; uVar3 = *(uint *)&pObj->field_0x4, uVar2 < uVar3 >> 0x1b; uVar2 = uVar2 + 1) {
    iVar1 = If_DsdObjFaninLit(pObj,uVar2);
    if (iVar1 == 0) {
      uVar3 = *(uint *)&pObj->field_0x4;
      break;
    }
    If_DsdManPrint_rec(pFile,p,iVar1,pPermLits,pnSupp);
  }
  iVar1 = (int)(char)(&DAT_007d7287)[uVar3 & 7];
LAB_003816b5:
  fputc(iVar1,(FILE *)pFile);
  return;
}

Assistant:

void If_DsdManPrint_rec( FILE * pFile, If_DsdMan_t * p, int iDsdLit, unsigned char * pPermLits, int * pnSupp )
{
    char OpenType[7]  = {0, 0, 0, '(', '[', '<', '{'};
    char CloseType[7] = {0, 0, 0, ')', ']', '>', '}'};
    If_DsdObj_t * pObj;
    int i, iFanin;
    fprintf( pFile, "%s", Abc_LitIsCompl(iDsdLit) ? "!" : ""  );
    pObj = If_DsdVecObj( &p->vObjs, Abc_Lit2Var(iDsdLit) );
    if ( If_DsdObjType(pObj) == IF_DSD_CONST0 )
        { fprintf( pFile, "0" ); return; }
    if ( If_DsdObjType(pObj) == IF_DSD_VAR )
    {
        int iPermLit = pPermLits ? (int)pPermLits[(*pnSupp)++] : Abc_Var2Lit((*pnSupp)++, 0);
        fprintf( pFile, "%s%c", Abc_LitIsCompl(iPermLit)? "!":"", 'a' + Abc_Lit2Var(iPermLit) );
        return;
    }
    if ( If_DsdObjType(pObj) == IF_DSD_PRIME )
        Abc_TtPrintHexRev( pFile, If_DsdObjTruth(p, pObj), If_DsdObjFaninNum(pObj) );
    fprintf( pFile, "%c", OpenType[If_DsdObjType(pObj)] );
    If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
        If_DsdManPrint_rec( pFile, p, iFanin, pPermLits, pnSupp );
    fprintf( pFile, "%c", CloseType[If_DsdObjType(pObj)] );
}